

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O0

TestResult * __thiscall JsonTest::TestResult::operator<<(TestResult *this,Int64 value)

{
  TestResult *pTVar1;
  string *in_RDI;
  LargestInt in_stack_00000008;
  
  pTVar1 = (TestResult *)&stack0xffffffffffffffd0;
  Json::valueToString_abi_cxx11_(in_stack_00000008);
  pTVar1 = addToLastFailure(pTVar1,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return pTVar1;
}

Assistant:

TestResult& TestResult::operator<<(Json::Int64 value) {
  return addToLastFailure(Json::valueToString(value));
}